

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O0

QVariantHash __thiscall QCborMap::toVariantHash(QCborMap *this)

{
  long lVar1;
  qsizetype qVar2;
  QCborContainerPrivate *in_RSI;
  Data *in_RDI;
  long in_FS_OFFSET;
  iterator iVar3;
  qsizetype i;
  QVariantHash *retval;
  QString *in_stack_ffffffffffffff28;
  QCborValue *in_stack_ffffffffffffff30;
  Data<QHashPrivate::Node<QString,_QVariant>_> *in_stack_ffffffffffffff40;
  QCborContainerPrivate *this_00;
  QCborContainerPrivate *local_88;
  ConversionMode in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 uVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  QHash<QString,_QVariant>::QHash((QHash<QString,_QVariant> *)in_RDI);
  size((QCborMap *)in_stack_ffffffffffffff30);
  QHash<QString,_QVariant>::reserve
            ((QHash<QString,_QVariant> *)in_stack_ffffffffffffff30,
             (qsizetype)in_stack_ffffffffffffff28);
  local_88 = (QCborContainerPrivate *)0x0;
  while (this_00 = local_88, qVar2 = size((QCborMap *)in_stack_ffffffffffffff30),
        SBORROW8((long)this_00,qVar2 * 2) != (long)this_00 + qVar2 * -2 < 0) {
    QExplicitlySharedDataPointer<QCborContainerPrivate>::data
              ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x48c838);
    makeString(in_RSI,CONCAT17(uVar4,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c);
    QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
              ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x48c85b);
    QCborContainerPrivate::valueAt(this_00,(qsizetype)in_stack_ffffffffffffff40);
    ::QCborValue::toVariant((QCborValue *)CONCAT17(uVar4,in_stack_ffffffffffffff90));
    iVar3 = QHash<QString,_QVariant>::insert
                      ((QHash<QString,_QVariant> *)in_stack_ffffffffffffff30,
                       in_stack_ffffffffffffff28,(QVariant *)0x48c8a6);
    in_stack_ffffffffffffff40 = iVar3.i.d;
    ::QVariant::~QVariant((QVariant *)in_stack_ffffffffffffff30);
    ::QCborValue::~QCborValue(in_stack_ffffffffffffff30);
    QString::~QString((QString *)0x48c8ed);
    local_88 = (QCborContainerPrivate *)
               ((long)&(local_88->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QVariantHash)in_RDI;
}

Assistant:

QVariantHash QCborMap::toVariantHash() const
{
    QVariantHash retval;
    retval.reserve(size());
    for (qsizetype i = 0; i < 2 * size(); i += 2)
        retval.insert(makeString(d.data(), i), d->valueAt(i + 1).toVariant());
    return retval;
}